

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O0

int strcmp(char *__s1,char *__s2)

{
  char *pcStack_20;
  int res;
  char *rhs_local;
  char *lhs_local;
  
  pcStack_20 = __s2;
  rhs_local = __s1;
  while( true ) {
    if (*rhs_local != *pcStack_20) {
      return (int)*rhs_local - (int)*pcStack_20;
    }
    if (*rhs_local == '\0') break;
    rhs_local = rhs_local + 1;
    pcStack_20 = pcStack_20 + 1;
  }
  return 0;
}

Assistant:

int strcmp(const char *lhs, const char *rhs) {
    for (; *lhs == *rhs; ++lhs, ++rhs) {
        if (*lhs == '\0') {
            return 0;
        }
    }
    const int res = *lhs - *rhs;
    return res;
}